

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer.cc
# Opt level: O3

bool __thiscall
google::protobuf::util::MessageDifferencer::CompareRepeatedField
          (MessageDifferencer *this,Message *message1,Message *message2,int unpacked_any,
          FieldDescriptor *repeated_field,
          vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
          *parent_fields)

{
  bool bVar1;
  undefined1 uVar2;
  Message *pMVar3;
  Message *pMVar4;
  undefined4 in_register_0000000c;
  Message *message1_00;
  long lVar5;
  long *extraout_RDX;
  int unaff_EBX;
  FieldDescriptor *field;
  SpecificField *pSVar6;
  MessageDifferencer *this_00;
  pointer pSVar7;
  FieldDescriptor *message2_00;
  int unpacked_any_00;
  int unaff_R12D;
  byte bVar9;
  Metadata MVar10;
  Metadata MVar11;
  vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
  vStack_110;
  long *plStack_f8;
  MessageDifferencer *pMStack_f0;
  string *psStack_e8;
  Reporter *pRStack_e0;
  SpecificField SStack_d8;
  vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
  *pvStack_78;
  Message *pMStack_70;
  MessageDifferencer *pMStack_68;
  FieldDescriptor *pFStack_60;
  Message *pMStack_58;
  code *pcStack_50;
  vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
  *local_40;
  FieldComparator FStack_38;
  vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
  *pvVar8;
  
  message1_00 = (Message *)CONCAT44(in_register_0000000c,unpacked_any);
  bVar9 = 0;
  if (repeated_field->type_ == '\v') {
    pcStack_50 = (code *)0x313faa;
    field = (FieldDescriptor *)message1;
    message2_00 = repeated_field;
    pvVar8 = parent_fields;
    bVar1 = FieldDescriptor::is_map_message_type(repeated_field);
    unpacked_any_00 = (int)pvVar8;
    if (bVar1) {
      this_00 = (MessageDifferencer *)&stack0xffffffffffffffc0;
      pcStack_50 = IsMatch;
      CompareRepeatedField(this_00);
      pvStack_78 = parent_fields;
      pMStack_70 = message1;
      pMStack_68 = this;
      pFStack_60 = repeated_field;
      pMStack_58 = message2;
      pcStack_50 = (code *)(ulong)(uint)unpacked_any;
      std::
      vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
      ::vector(&vStack_110,local_40);
      if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) == 10) {
        pRStack_e0 = this_00->reporter_;
        psStack_e8 = this_00->output_string_;
        this_00->reporter_ = (Reporter *)FStack_38._vptr_FieldComparator;
        this_00->output_string_ = (string *)0x0;
        pMStack_f0 = this_00;
        if (extraout_RDX == (long *)0x0) {
          uVar2 = CompareFieldValueUsingParentFields
                            (this_00,message1_00,(Message *)message2_00,unpacked_any_00,field,
                             unaff_EBX,unaff_R12D,&vStack_110);
        }
        else {
          plStack_f8 = extraout_RDX;
          MVar10 = Message::GetMetadata(message1_00);
          MVar11 = Message::GetMetadata((Message *)message2_00);
          pMVar3 = Reflection::GetRepeatedMessage(MVar10.reflection,message1_00,field,unaff_EBX);
          pMVar4 = Reflection::GetRepeatedMessage
                             (MVar11.reflection,(Message *)message2_00,field,unaff_R12D);
          SStack_d8.unknown_field_number = -1;
          SStack_d8.unknown_field_type = TYPE_VARINT;
          SStack_d8.map_entry1 = (Message *)0x0;
          SStack_d8.map_entry2 = (Message *)0x0;
          SStack_d8.unknown_field_set1 = (UnknownFieldSet *)0x0;
          SStack_d8.unknown_field_set2 = (UnknownFieldSet *)0x0;
          SStack_d8.unknown_field_index1 = -1;
          SStack_d8.unknown_field_index2 = -1;
          SStack_d8.forced_compare_no_presence_ = false;
          SStack_d8.message1 = message1_00;
          SStack_d8.message2 = (Message *)message2_00;
          SStack_d8.unpacked_any = unpacked_any_00;
          SStack_d8.field = field;
          if (field->type_ == '\v') {
            bVar1 = FieldDescriptor::is_map_message_type(field);
            if (bVar1) {
              SStack_d8.map_entry1 = pMVar3;
              SStack_d8.map_entry2 = pMVar4;
            }
          }
          if (vStack_110.
              super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              vStack_110.
              super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<google::protobuf::util::MessageDifferencer::SpecificField,std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>>
            ::_M_realloc_insert<google::protobuf::util::MessageDifferencer::SpecificField_const&>
                      ((vector<google::protobuf::util::MessageDifferencer::SpecificField,std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>>
                        *)&vStack_110,
                       (iterator)
                       vStack_110.
                       super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                       ._M_impl.super__Vector_impl_data._M_finish,&SStack_d8);
          }
          else {
            pSVar6 = &SStack_d8;
            pSVar7 = vStack_110.
                     super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            for (lVar5 = 0xc; lVar5 != 0; lVar5 = lVar5 + -1) {
              pSVar7->message1 = pSVar6->message1;
              pSVar6 = (SpecificField *)((long)pSVar6 + ((ulong)bVar9 * -2 + 1) * 8);
              pSVar7 = (SpecificField *)((long)pSVar7 + (ulong)bVar9 * -0x10 + 8);
            }
            vStack_110.
            super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 vStack_110.
                 super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 1;
          }
          uVar2 = (**(code **)(*plStack_f8 + 0x10))(plStack_f8,pMVar3,pMVar4,0,&vStack_110);
        }
        pMStack_f0->reporter_ = pRStack_e0;
        pMStack_f0->output_string_ = psStack_e8;
      }
      else {
        uVar2 = CompareFieldValueUsingParentFields
                          (this_00,message1_00,(Message *)message2_00,unpacked_any_00,field,
                           unaff_EBX,unaff_R12D,&vStack_110);
      }
      if (vStack_110.
          super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(vStack_110.
                        super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)vStack_110.
                              super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)vStack_110.
                              super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      return (bool)uVar2;
    }
  }
  bVar1 = CompareRepeatedRep(this,message1,message2,unpacked_any,repeated_field,parent_fields);
  return bVar1;
}

Assistant:

bool MessageDifferencer::CompareRepeatedField(
    const Message& message1, const Message& message2, int unpacked_any,
    const FieldDescriptor* repeated_field,
    std::vector<SpecificField>* parent_fields) {
  ABSL_DCHECK(!repeated_field->is_map());
  return CompareRepeatedRep(message1, message2, unpacked_any, repeated_field,
                            parent_fields);
}